

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O3

any __thiscall OpenMD::SelectionCompiler::valuePeek(SelectionCompiler *this)

{
  long lVar1;
  long lVar2;
  code *pcVar3;
  _Storage _Var4;
  _Storage extraout_RDX;
  long in_RSI;
  any aVar5;
  _Arg __arg;
  
  lVar1 = *(long *)(in_RSI + 0x130);
  lVar2 = *(long *)(in_RSI + 0x118);
  _Var4._M_ptr = (void *)(*(long *)(in_RSI + 0x120) - lVar2 >> 3);
  if (lVar1 == (long)_Var4._M_ptr * -0x5555555555555555) {
    (this->filename)._M_dataplus._M_p = (pointer)0x0;
    (this->filename)._M_string_length = 0;
  }
  else {
    _Var4._M_ptr = (void *)(lVar1 * 3);
    (this->filename)._M_string_length = 0;
    pcVar3 = *(code **)(lVar2 + 8 + lVar1 * 0x18);
    if (pcVar3 == (code *)0x0) {
      (this->filename)._M_dataplus._M_p = (pointer)0x0;
    }
    else {
      (*pcVar3)(2,lVar2 + lVar1 * 0x18 + 8);
      _Var4 = extraout_RDX;
    }
  }
  aVar5._M_storage._M_ptr = _Var4._M_ptr;
  aVar5._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)this;
  return aVar5;
}

Assistant:

std::any SelectionCompiler::valuePeek() {
    if (itokenInfix == atokenInfix.size()) {
      return std::any();
    } else {
      return atokenInfix[itokenInfix].value;
    }
  }